

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstexprConstructor
          (MessageGenerator *this,Printer *p)

{
  Descriptor *desc;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  initializer_list<google::protobuf::io::Printer::Sub> v_02;
  undefined8 uVar1;
  bool bVar2;
  Sub *local_670;
  Sub *local_5f0;
  Sub *local_5c0;
  basic_string_view<char,_std::char_traits<char>_> local_578;
  basic_string_view<char,_std::char_traits<char>_> local_560;
  basic_string_view<char,_std::char_traits<char>_> local_548;
  undefined1 local_531;
  anon_class_16_2_fd512ddd_for_cb local_530;
  allocator<char> local_519;
  string local_518;
  Sub *local_4f8;
  Sub local_4f0;
  iterator local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_428;
  basic_string_view<char,_std::char_traits<char>_> local_410;
  undefined4 local_400;
  basic_string_view<char,_std::char_traits<char>_> local_3f8;
  undefined1 local_3e1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3e0;
  allocator<char> local_3c9;
  string local_3c8;
  undefined8 local_3a8;
  Sub local_3a0;
  iterator local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2d8;
  undefined1 local_2c8 [8];
  Formatter format;
  string local_298;
  undefined1 local_278 [192];
  iterator local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1a8;
  undefined1 local_198 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  c;
  Span<const_google::protobuf::io::Printer::Sub> local_168;
  undefined1 local_158 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Options local_130;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_58;
  Span<const_google::protobuf::io::Printer::Sub> local_40;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Printer *p_local;
  MessageGenerator *this_local;
  
  v.storage_.callback_buffer_._8_8_ = p;
  bVar2 = ShouldGenerateClass(this->descriptor_,&this->options_);
  uVar1 = v.storage_.callback_buffer_._8_8_;
  if (bVar2) {
    desc = this->descriptor_;
    Options::Options(&local_130,&this->options_);
    cpp::anon_unknown_0::ClassVars(&local_58,desc,&local_130);
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
              ((Span<google::protobuf::io::Printer::Sub_const> *)&local_40,&local_58);
    protobuf::io::Printer::WithVars
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_30,(Printer *)uVar1,local_40);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_58);
    Options::~Options(&local_130);
    uVar1 = v.storage_.callback_buffer_._8_8_;
    MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)(c.storage_.callback_buffer_ + 8),this->descriptor_,&this->options_);
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
              ((Span<google::protobuf::io::Printer::Sub_const> *)&local_168,
               (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)(c.storage_.callback_buffer_ + 8));
    protobuf::io::Printer::WithVars
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_158,(Printer *)uVar1,local_168);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)(c.storage_.callback_buffer_ + 8));
    uVar1 = v.storage_.callback_buffer_._8_8_;
    format.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.soo_data[0xe] = '\x01';
    local_278._0_8_ = local_278 + 8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"constexpr",
               (allocator<char> *)
               ((long)&format.vars_.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
               + 0x1f));
    protobuf::io::Printer::Sub::Sub<char_const(&)[19]>
              ((Sub *)(local_278 + 8),&local_298,(char (*) [19])"PROTOBUF_CONSTEXPR");
    format.vars_.
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.soo_data[0xe] = '\0';
    local_1b8 = (iterator)(local_278 + 8);
    local_1b0 = 1;
    v_02._M_len = 1;
    v_02._M_array = local_1b8;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_1a8._M_local_buf,v_02);
    protobuf::io::Printer::WithVars
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_198,(Printer *)uVar1,
               (Span<const_google::protobuf::io::Printer::Sub>)local_1a8);
    local_5c0 = (Sub *)&local_1b8;
    do {
      local_5c0 = local_5c0 + -1;
      protobuf::io::Printer::Sub::~Sub(local_5c0);
    } while (local_5c0 != (Sub *)(local_278 + 8));
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&format.vars_.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
               + 0x1f));
    Formatter::Formatter((Formatter *)local_2c8,(Printer *)v.storage_.callback_buffer_._8_8_);
    bVar2 = IsMapEntryMessage(this->descriptor_);
    if ((bVar2) ||
       (bVar2 = HasImplData(this->descriptor_,&this->options_),
       uVar1 = v.storage_.callback_buffer_._8_8_, !bVar2)) {
      uVar1 = v.storage_.callback_buffer_._8_8_;
      local_3e1 = 1;
      local_3a8 = &local_3a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"base",&local_3c9);
      local_3e0._8_8_ = v.storage_.callback_buffer_ + 8;
      local_3e0._M_allocated_capacity = (size_type)this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateConstexprConstructor(google::protobuf::io::Printer*)::__0>
                (&local_3a0,&local_3c8,(anon_class_16_2_fd512ddd_for_cb *)&local_3e0);
      local_3e1 = 0;
      local_2e8 = &local_3a0;
      local_2e0 = 1;
      v_01._M_len = 1;
      v_01._M_array = local_2e8;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_2d8._M_local_buf,v_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3f8,
                 "\n              //~ Templatize constexpr constructor as a workaround for a bug in\n              //~ gcc 12 (warning in gcc 13).\n              template <typename>\n              $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                  : $base$($classname$_class_data_.base()){}\n#else   // PROTOBUF_CUSTOM_VTABLE\n                  : $base$() {\n              }\n#endif  // PROTOBUF_CUSTOM_VTABLE\n            "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                ((Printer *)uVar1,local_2d8._M_allocated_capacity,local_2d8._8_8_,local_3f8._M_len,
                 local_3f8._M_str);
      local_5f0 = (Sub *)&local_2e8;
      do {
        local_5f0 = local_5f0 + -1;
        protobuf::io::Printer::Sub::~Sub(local_5f0);
      } while (local_5f0 != &local_3a0);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
      local_400 = 1;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_410,"\n");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit((Printer *)uVar1,local_410._M_len,local_410._M_str);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      local_531 = 1;
      local_4f8 = &local_4f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"init",&local_519);
      local_530.p = (Printer **)(v.storage_.callback_buffer_ + 8);
      local_530.this = this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateConstexprConstructor(google::protobuf::io::Printer*)::__1>
                (&local_4f0,&local_518,&local_530);
      local_531 = 0;
      local_438 = &local_4f0;
      local_430 = 1;
      v_00._M_len = 1;
      v_00._M_array = local_438;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_428._M_local_buf,v_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_548,
                 "\n            inline constexpr $classname$::Impl_::Impl_(\n                ::_pbi::ConstantInitialized) noexcept\n                //~\n                $init$ {}\n          "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                ((Printer *)uVar1,local_428._M_allocated_capacity,local_428._8_8_,local_548._M_len,
                 local_548._M_str);
      local_670 = (Sub *)&local_438;
      do {
        local_670 = local_670 + -1;
        protobuf::io::Printer::Sub::~Sub(local_670);
      } while (local_670 != &local_4f0);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_560,"\n");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit((Printer *)uVar1,local_560._M_len,local_560._M_str);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_578,
                 "\n        template <typename>\n        $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n            : $superclass$($classname$_class_data_.base()),\n#else   // PROTOBUF_CUSTOM_VTABLE\n            : $superclass$(),\n#endif  // PROTOBUF_CUSTOM_VTABLE\n              _impl_(::_pbi::ConstantInitialized()) {\n        }\n      "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit((Printer *)uVar1,local_578._M_len,local_578._M_str);
      local_400 = 0;
    }
    Formatter::~Formatter((Formatter *)local_2c8);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_198);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_158);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_30);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateConstexprConstructor(io::Printer* p) {
  if (!ShouldGenerateClass(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  auto c = p->WithVars({{"constexpr", "PROTOBUF_CONSTEXPR"}});
  Formatter format(p);

  if (IsMapEntryMessage(descriptor_) || !HasImplData(descriptor_, options_)) {
    p->Emit({{"base",
              [&] {
                if (IsMapEntryMessage(descriptor_)) {
                  p->Emit("$classname$::MapEntry");
                } else {
                  p->Emit("$superclass$");
                }
              }}},
            R"cc(
              //~ Templatize constexpr constructor as a workaround for a bug in
              //~ gcc 12 (warning in gcc 13).
              template <typename>
              $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)
#if defined(PROTOBUF_CUSTOM_VTABLE)
                  : $base$($classname$_class_data_.base()){}
#else   // PROTOBUF_CUSTOM_VTABLE
                  : $base$() {
              }
#endif  // PROTOBUF_CUSTOM_VTABLE
            )cc");
    return;
  }

  // Generate Impl_::Imp_(::_pbi::ConstantInitialized);
  // We use separate p->Emit() calls for LF and #ifdefs as they result in
  // awkward layout and more awkward indenting of the function statement.
  p->Emit("\n");
  p->Emit({{"init", [&] { GenerateImplMemberInit(p, InitType::kConstexpr); }}},
          R"cc(
            inline constexpr $classname$::Impl_::Impl_(
                ::_pbi::ConstantInitialized) noexcept
                //~
                $init$ {}
          )cc");
  p->Emit("\n");

  p->Emit(
      R"cc(
        template <typename>
        $constexpr$ $classname$::$classname$(::_pbi::ConstantInitialized)
#if defined(PROTOBUF_CUSTOM_VTABLE)
            : $superclass$($classname$_class_data_.base()),
#else   // PROTOBUF_CUSTOM_VTABLE
            : $superclass$(),
#endif  // PROTOBUF_CUSTOM_VTABLE
              _impl_(::_pbi::ConstantInitialized()) {
        }
      )cc");
}